

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::anon_unknown_12::outlier_variance
                 (Estimate<double> mean,Estimate<double> stddev,int n)

{
  double *pdVar1;
  __type_conflict1 _Var2;
  double dVar3;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  undefined1 local_88 [8];
  anon_class_24_3_0d284b40 var_out;
  anon_class_32_4_9b8c116d c_max;
  double sb2;
  double sg2;
  double local_38;
  double local_30;
  double sg;
  double mg_min;
  double mn;
  double sb;
  int n_local;
  
  mn = stddev.point;
  mg_min = mean.point / (double)n;
  sg = mg_min / 2.0;
  local_38 = sg / 4.0;
  sb._4_4_ = n;
  _Var2 = std::sqrt<int>(n);
  sg2 = stddev.point / _Var2;
  pdVar1 = std::min<double>(&local_38,&sg2);
  local_30 = *pdVar1;
  var_out.sb2 = local_30 * local_30;
  dVar3 = mn * mn;
  var_out.sg2._0_4_ = sb._4_4_;
  local_88._0_4_ = sb._4_4_;
  var_out._0_8_ = dVar3;
  local_90 = outlier_variance::anon_class_24_3_0d284b40::operator()
                       ((anon_class_24_3_0d284b40 *)local_88,1.0);
  local_a0 = outlier_variance::anon_class_32_4_9b8c116d::operator()
                       ((anon_class_32_4_9b8c116d *)&var_out.sg2,0.0);
  local_a8 = outlier_variance::anon_class_32_4_9b8c116d::operator()
                       ((anon_class_32_4_9b8c116d *)&var_out.sg2,sg);
  pdVar1 = std::min<double>(&local_a0,&local_a8);
  local_98 = outlier_variance::anon_class_24_3_0d284b40::operator()
                       ((anon_class_24_3_0d284b40 *)local_88,*pdVar1);
  pdVar1 = std::min<double>(&local_90,&local_98);
  return *pdVar1 / dVar3;
}

Assistant:

static double outlier_variance( Estimate<double> mean,
                                                Estimate<double> stddev,
                                                int n ) {
                    double sb = stddev.point;
                    double mn = mean.point / n;
                    double mg_min = mn / 2.;
                    double sg = (std::min)( mg_min / 4., sb / std::sqrt( n ) );
                    double sg2 = sg * sg;
                    double sb2 = sb * sb;

                    auto c_max = [n, mn, sb2, sg2]( double x ) -> double {
                        double k = mn - x;
                        double d = k * k;
                        double nd = n * d;
                        double k0 = -n * nd;
                        double k1 = sb2 - n * sg2 + nd;
                        double det = k1 * k1 - 4 * sg2 * k0;
                        return static_cast<int>( -2. * k0 /
                                                 ( k1 + std::sqrt( det ) ) );
                    };

                    auto var_out = [n, sb2, sg2]( double c ) {
                        double nc = n - c;
                        return ( nc / n ) * ( sb2 - nc * sg2 );
                    };

                    return (std::min)( var_out( 1 ),
                                       var_out(
                                           (std::min)( c_max( 0. ),
                                                       c_max( mg_min ) ) ) ) /
                           sb2;
                }